

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O0

pair<char,_char> computeEntry(char *base1,char *qual1,char *base2,char *qual2)

{
  int *piVar1;
  reference pvVar2;
  char *in_RCX;
  char *in_RDX;
  char *in_RSI;
  char *in_RDI;
  pair<char,_char> result;
  size_type in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  pair<char,_char> local_2;
  
  std::pair<char,_char>::pair<char,_char,_true>(&local_2);
  if (*in_RDI == *in_RDX) {
    local_2.first = *in_RDI;
    std::array<std::array<int,_127UL>,_127UL>::operator[]
              ((array<std::array<int,_127UL>,_127UL> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
    std::array<int,_127UL>::operator[]
              ((array<int,_127UL> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
    piVar1 = std::min<int>((int *)&stack0xffffffffffffffd4,(int *)&stack0xffffffffffffffd0);
    local_2.second = (char)*piVar1;
  }
  else if (*in_RSI < *in_RCX) {
    local_2.first = *in_RDX;
    std::array<std::array<int,_127UL>,_127UL>::operator[]
              ((array<std::array<int,_127UL>,_127UL> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
    pvVar2 = std::array<int,_127UL>::operator[]
                       ((array<int,_127UL> *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8);
    local_2.second = (char)*pvVar2 + '!';
  }
  else {
    local_2.first = *in_RDI;
    std::array<std::array<int,_127UL>,_127UL>::operator[]
              ((array<std::array<int,_127UL>,_127UL> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffc8);
    pvVar2 = std::array<int,_127UL>::operator[]
                       ((array<int,_127UL> *)
                        CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffc8);
    local_2.second = (char)*pvVar2 + '!';
  }
  return local_2;
}

Assistant:

std::pair<char,char> computeEntry(const char& base1, const char& qual1, const char& base2, const char& qual2){
    std::pair<char,char> result;

    if (base1==base2){
        result.first = base1;
        result.second = std::min(error_agreement[qual1][qual2]+33,126);
    }
    else if (qual1>=qual2) {
        result.first = base1;
        result.second = error_disagreement[qual1][qual2]+33;
    } else {
        result.first = base2;
        result.second = error_disagreement[qual2][qual1]+33;
    }
    return result;
}